

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamRandomAccessController::SetErrorString
          (BamRandomAccessController *this,string *where,string *what)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  pcVar1 = (where->_M_dataplus)._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + where->_M_string_length);
  std::__cxx11::string::append((char *)local_60);
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_60,(ulong)(what->_M_dataplus)._M_p)
  ;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_30 = *plVar3;
    lStack_28 = plVar2[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar3;
    local_40 = (long *)*plVar2;
  }
  local_38 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->m_errorString,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return;
}

Assistant:

void BamRandomAccessController::SetErrorString(const std::string& where, const std::string& what)
{
    m_errorString = where + ": " + what;
}